

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_jsonmodelserialiser.cpp
# Opt level: O0

void __thiscall tst_JsonModelSerialiser::basicSaveLoadByteArray(tst_JsonModelSerialiser *this)

{
  QAbstractItemModel *sourceModel_00;
  QAbstractItemModel *destinationModel_00;
  int iVar1;
  undefined8 *puVar2;
  JsonModelSerialiser local_38 [8];
  JsonModelSerialiser serialiser;
  QAbstractItemModel *destinationModel;
  QAbstractItemModel *sourceModel;
  tst_JsonModelSerialiser *this_local;
  
  iVar1 = qMetaTypeId<QAbstractItemModel_const*>();
  puVar2 = (undefined8 *)QTest::qData("sourceModel",iVar1);
  sourceModel_00 = (QAbstractItemModel *)*puVar2;
  iVar1 = qMetaTypeId<QAbstractItemModel*>();
  puVar2 = (undefined8 *)QTest::qData("destinationModel",iVar1);
  destinationModel_00 = (QAbstractItemModel *)*puVar2;
  JsonModelSerialiser::JsonModelSerialiser(local_38,(QObject *)0x0);
  tst_SerialiserCommon::saveLoadByteArray
            (&this->super_tst_SerialiserCommon,(AbstractModelSerialiser *)local_38,sourceModel_00,
             destinationModel_00,true,true);
  QObject::deleteLater();
  JsonModelSerialiser::~JsonModelSerialiser(local_38);
  return;
}

Assistant:

void tst_JsonModelSerialiser::basicSaveLoadByteArray()
{
    QFETCH(const QAbstractItemModel *, sourceModel);
    QFETCH(QAbstractItemModel *, destinationModel);
    JsonModelSerialiser serialiser;
    saveLoadByteArray(&serialiser, sourceModel, destinationModel, true);
    destinationModel->deleteLater();
}